

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O1

bool __thiscall
double_conversion::FastDtoa
          (double_conversion *this,double v,FastDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  FastDtoaMode FVar4;
  FastDtoaMode FVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  undefined4 in_register_00000014;
  long lVar12;
  ulong uVar13;
  uint64_t ten_kappa;
  ulong uVar14;
  uint uVar15;
  int *unit;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint64_t uVar24;
  long in_FS_OFFSET;
  DiyFp DVar25;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  int mk;
  int *in_stack_ffffffffffffff48;
  int local_6c;
  DiyFp local_68;
  DiyFp local_58;
  DiyFp local_48;
  long local_38;
  
  lVar12 = CONCAT44(in_register_00000014,requested_digits);
  unit = buffer._8_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar15 = (uint)this;
  local_48.f_ = (uint64_t)v;
  if (uVar15 < 2) {
    DVar25 = Double::AsNormalizedDiyFp((Double *)&local_48);
    iVar10 = DVar25.e_;
    local_48.f_ = 0;
    local_48.e_ = 0;
    local_48._12_4_ = 0xaaaaaaaa;
    local_58.f_ = 0;
    local_58.e_ = 0;
    local_58._12_4_ = 0xaaaaaaaa;
    if (uVar15 == 0) {
      local_68.f_ = (uint64_t)v;
      Double::NormalizedBoundaries((Double *)&local_68,&local_48,&local_58);
    }
    else {
      local_68.f_ = CONCAT44(local_68.f_._4_4_,(float)v);
      Single::NormalizedBoundaries((Single *)&local_68,&local_48,&local_58);
    }
    local_68.f_ = 0;
    local_68.e_ = 0;
    local_68._12_4_ = 0xaaaaaaaa;
    local_6c = -0x55555556;
    PowersOfTenCache::GetCachedPowerForBinaryExponentRange
              (-0x7c - iVar10,-0x60 - iVar10,&local_68,&local_6c);
    uVar9 = DVar25.f_ & 0xffffffff;
    uVar20 = local_68.f_ & 0xffffffff;
    uVar16 = local_68.f_ >> 0x20;
    uVar14 = uVar16 * uVar9;
    uVar6 = (DVar25.f_ >> 0x20) * uVar20;
    uVar13 = (local_48.f_ & 0xffffffff) * uVar16;
    uVar22 = (local_48.f_ >> 0x20) * uVar20;
    uVar17 = uVar16 * (local_58.f_ & 0xffffffff);
    uVar23 = (local_58.f_ >> 0x20) * uVar20;
    lVar18 = (uVar17 >> 0x20) + (uVar23 >> 0x20) + (local_58.f_ >> 0x20) * uVar16;
    uVar23 = (uVar17 & 0xffffffff) +
             (uVar23 & 0xffffffff) + ((local_58.f_ & 0xffffffff) * uVar20 >> 0x20) + 0x80000000 >>
             0x20;
    uVar21 = uVar23 + lVar18 + 1;
    cVar1 = (char)(local_68.e_ + iVar10);
    bVar7 = -cVar1 - 0x40;
    bVar8 = -cVar1;
    uVar24 = 1L << (bVar8 & 0x3f);
    uVar17 = uVar21 >> (bVar8 & 0x3f);
    uVar23 = ((lVar18 + uVar23) -
             (((uVar13 & 0xffffffff) +
               (uVar22 & 0xffffffff) + ((local_48.f_ & 0xffffffff) * uVar20 >> 0x20) + 0x80000000 >>
              0x20) + (uVar13 >> 0x20) + (uVar22 >> 0x20) + (local_48.f_ >> 0x20) * uVar16)) + 2;
    uVar13 = uVar24 - 1;
    uVar16 = uVar21 & uVar13;
    uVar15 = (local_68.e_ + iVar10) * 0x4d1 + 0x26d51 >> 0xc;
    if (*(uint *)(kSmallPowersOfTen + (long)(int)uVar15 * 4 + 4) <= (uint)uVar17) {
      uVar15 = uVar15 + 1;
    }
    uVar22 = (ulong)(int)uVar15;
    uVar19 = *(uint *)(kSmallPowersOfTen + uVar22 * 4);
    *unit = 0;
    iVar10 = (int)uVar21 -
             ((int)(uVar6 >> 0x20) + (int)(local_68.f_ >> 0x20) * DVar25.f_._4_4_ +
              (int)(uVar14 >> 0x20) +
             (int)((uVar14 & 0xffffffff) + (uVar6 & 0xffffffff) + (uVar9 * uVar20 >> 0x20) +
                   0x80000000 >> 0x20));
    uVar3 = (int)uVar15 >> 0x1f & uVar15;
    while (0 < (int)uVar15) {
      uVar6 = uVar17 & 0xffffffff;
      uVar17 = uVar6 % (ulong)uVar19;
      *(char *)(lVar12 + *unit) = (char)(uVar6 / uVar19) + '0';
      buffer_00.length_ = *unit + 1;
      *unit = buffer_00.length_;
      uVar6 = (uVar17 << (bVar7 & 0x3f)) + uVar16;
      if (uVar6 < uVar23) {
        buffer_00.start_ = (char *)lVar12;
        buffer_00._12_4_ = 0;
        bVar2 = RoundWeed(buffer_00,iVar10,uVar23,uVar6,(ulong)uVar19 << (bVar7 & 0x3f),1,
                          (uint64_t)unit);
        uVar22 = (ulong)bVar2;
      }
      else {
        uVar19 = uVar19 / 10;
      }
      uVar15 = uVar15 - 1;
      if (uVar6 < uVar23) goto LAB_003ea549;
    }
    ten_kappa = 1;
    uVar15 = uVar3;
    do {
      ten_kappa = ten_kappa * 10;
      uVar23 = uVar23 * 10;
      *(char *)(lVar12 + *unit) = (char)(uVar16 * 10 >> (bVar7 & 0x3f)) + '0';
      buffer_01.length_ = *unit + 1;
      *unit = buffer_01.length_;
      uVar16 = uVar16 * 10 & uVar13;
      if (uVar16 < uVar23) {
        buffer_01.start_ = (char *)lVar12;
        buffer_01._12_4_ = 0;
        bVar2 = RoundWeed(buffer_01,(int)ten_kappa * iVar10,uVar23,uVar16,uVar24,ten_kappa,
                          (uint64_t)unit);
        uVar22 = (ulong)bVar2;
      }
      uVar15 = uVar15 - 1;
    } while (uVar23 <= uVar16);
LAB_003ea549:
    iVar10 = uVar15 - local_6c;
    goto LAB_003ea615;
  }
  if (uVar15 != 2) {
    abort();
  }
  DVar25 = Double::AsNormalizedDiyFp((Double *)&local_48);
  iVar10 = DVar25.e_;
  local_48.f_ = 0;
  local_48.e_ = 0;
  local_48._12_4_ = 0xaaaaaaaa;
  local_58.f_ = CONCAT44(local_58.f_._4_4_,0xaaaaaaaa);
  PowersOfTenCache::GetCachedPowerForBinaryExponentRange
            (-0x7c - iVar10,-0x60 - iVar10,&local_48,(int *)&local_58);
  uVar17 = DVar25.f_ >> 0x20;
  uVar6 = DVar25.f_ & 0xffffffff;
  uVar13 = (local_48.f_ >> 0x20) * uVar6;
  uVar23 = uVar17 * (local_48.f_ & 0xffffffff);
  cVar1 = (char)(iVar10 + local_48.e_);
  bVar7 = -cVar1 - 0x40;
  bVar8 = -cVar1;
  uVar24 = 1L << (bVar8 & 0x3f);
  uVar17 = ((uVar13 & 0xffffffff) +
            (uVar23 & 0xffffffff) + ((local_48.f_ & 0xffffffff) * uVar6 >> 0x20) + 0x80000000 >>
           0x20) + (uVar13 >> 0x20) + (uVar23 >> 0x20) + (local_48.f_ >> 0x20) * uVar17;
  uVar13 = uVar17 >> (bVar8 & 0x3f);
  uVar17 = uVar17 & uVar24 - 1;
  iVar10 = (iVar10 + local_48.e_) * 0x4d1 + 0x26d51 >> 0xc;
  if (*(uint *)(kSmallPowersOfTen + (long)iVar10 * 4 + 4) <= (uint)uVar13) {
    iVar10 = iVar10 + 1;
  }
  uVar15 = *(uint *)(kSmallPowersOfTen + (long)iVar10 * 4);
  *unit = 0;
  do {
    iVar11 = (int)uVar13;
    if (iVar10 < 1) {
      uVar23 = (ulong)uVar15;
      FVar4 = mode;
      break;
    }
    uVar23 = uVar13 & 0xffffffff;
    uVar13 = uVar23 % (ulong)uVar15;
    iVar11 = (int)uVar13;
    *(char *)(lVar12 + *unit) = (char)(uVar23 / uVar15) + '0';
    *unit = *unit + 1;
    FVar4 = FAST_DTOA_SHORTEST;
    iVar10 = iVar10 + -1;
    uVar23 = (ulong)uVar15 / 10;
    if (mode == FAST_DTOA_SHORTEST_SINGLE) {
      uVar23 = (ulong)uVar15;
    }
    uVar15 = (uint)uVar23;
    mode = mode - FAST_DTOA_SHORTEST_SINGLE;
  } while (mode != FAST_DTOA_SHORTEST);
  local_68.f_ = CONCAT44(local_68.f_._4_4_,iVar10);
  if (FVar4 == FAST_DTOA_SHORTEST) {
    iVar11 = (iVar11 << (bVar7 & 0x3f)) + (int)uVar17;
    iVar10 = *unit;
    uVar24 = uVar23 << (bVar7 & 0x3f);
    uVar13 = 1;
  }
  else {
    bVar2 = false;
    uVar13 = 1;
    if ((0 < (int)FVar4) && (1 < uVar17)) {
      do {
        uVar13 = uVar13 * 10;
        *(char *)(lVar12 + *unit) = (char)(uVar17 * 10 >> (bVar7 & 0x3f)) + '0';
        *unit = *unit + 1;
        FVar5 = FVar4 - FAST_DTOA_SHORTEST_SINGLE;
        uVar17 = uVar17 * 10 & uVar24 - 1;
        iVar10 = iVar10 + -1;
        if ((int)FVar4 < 2) break;
        FVar4 = FVar5;
      } while (uVar13 < uVar17);
      local_68.f_ = CONCAT44(local_68.f_._4_4_,iVar10);
      bVar2 = FVar5 == FAST_DTOA_SHORTEST;
    }
    if (!bVar2) {
      uVar22 = 0;
      goto LAB_003ea60b;
    }
    iVar10 = *unit;
    iVar11 = (int)uVar17;
  }
  buffer_02.length_ = iVar10;
  buffer_02.start_ = (char *)lVar12;
  buffer_02._12_4_ = 0;
  bVar2 = RoundWeedCounted(buffer_02,iVar11,uVar24,uVar13,(uint64_t)&local_68,
                           in_stack_ffffffffffffff48);
  uVar22 = (ulong)bVar2;
LAB_003ea60b:
  iVar10 = (int)local_68.f_ - (int)local_58.f_;
LAB_003ea615:
  if ((uVar22 & 1) != 0) {
    *length = iVar10 + *unit;
    *(undefined1 *)(lVar12 + *unit) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)((byte)uVar22 & 1);
}

Assistant:

bool FastDtoa(double v,
              FastDtoaMode mode,
              int requested_digits,
              Vector<char> buffer,
              int* length,
              int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(v > 0);
  DOUBLE_CONVERSION_ASSERT(!Double(v).IsSpecial());

  bool result = false;
  int decimal_exponent = 0;
  switch (mode) {
    case FAST_DTOA_SHORTEST:
    case FAST_DTOA_SHORTEST_SINGLE:
      result = Grisu3(v, mode, buffer, length, &decimal_exponent);
      break;
    case FAST_DTOA_PRECISION:
      result = Grisu3Counted(v, requested_digits,
                             buffer, length, &decimal_exponent);
      break;
    default:
      DOUBLE_CONVERSION_UNREACHABLE();
  }
  if (result) {
    *decimal_point = *length + decimal_exponent;
    buffer[*length] = '\0';
  }
  return result;
}